

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_tracer.h
# Opt level: O1

stepping_variable __thiscall
AbstractIsolineTracer<double>::determine_integration_type(AbstractIsolineTracer<double> *this)

{
  double *pdVar1;
  double *pdVar2;
  stepping_variable sVar3;
  double *pdVar4;
  CoolPropBaseError *this_00;
  stepping_variable sVar5;
  double *pdVar6;
  double dVar7;
  string local_38;
  
  sVar3 = this->mode;
  if (this->mode == STEP_INVALID) {
    if (this->imposed_variable == IMPOSED_P) {
      dVar7 = this->imposed_value;
      pdVar4 = (this->pc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (this->pc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = pdVar4 + 1;
      sVar5 = STEP_IN_T;
      if (pdVar6 != pdVar1 && pdVar4 != pdVar1) {
        do {
          pdVar2 = pdVar6;
          if (*pdVar6 < *pdVar4 || *pdVar6 == *pdVar4) {
            pdVar2 = pdVar4;
          }
          pdVar4 = pdVar2;
          pdVar6 = pdVar6 + 1;
        } while (pdVar6 != pdVar1);
      }
    }
    else {
      if (this->imposed_variable != IMPOSED_T) {
        this_00 = (CoolPropBaseError *)__cxa_allocate_exception(0x30);
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"Invalid imposed variable","");
        CoolProp::CoolPropBaseError::CoolPropBaseError(this_00,&local_38,eValue);
        *(undefined ***)this_00 = &PTR__CoolPropBaseError_001abf40;
        __cxa_throw(this_00,&CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::
                             typeinfo,CoolProp::CoolPropBaseError::~CoolPropBaseError);
      }
      dVar7 = this->imposed_value;
      this->m_T = dVar7;
      pdVar4 = (this->Tc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (this->Tc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar6 = pdVar4 + 1;
      sVar5 = STEP_IN_P;
      if (pdVar6 != pdVar1 && pdVar4 != pdVar1) {
        do {
          pdVar2 = pdVar6;
          if (*pdVar4 < *pdVar6 || *pdVar4 == *pdVar6) {
            pdVar2 = pdVar4;
          }
          pdVar4 = pdVar2;
          pdVar6 = pdVar6 + 1;
        } while (pdVar6 != pdVar1);
      }
    }
    sVar3 = STEP_IN_RHO0;
    if (*pdVar4 <= dVar7) {
      sVar3 = sVar5;
    }
  }
  return sVar3;
}

Assistant:

virtual stepping_variable determine_integration_type() {

        // If already specified, override the default logic
        if (this->mode != STEP_INVALID) {
            return this->mode;
        }

        stepping_variable mode;
        if (imposed_variable == IMPOSED_T) {
            m_T = imposed_value;
            if (m_T < *std::min_element(Tc.cbegin(), Tc.cend())) {
                // This is a subcritical isotherm, T is less than both critical temperatures
                mode = AbstractIsolineTracer::STEP_IN_RHO0;
            }
            else {
                mode = AbstractIsolineTracer::STEP_IN_P;
            }
        }
        else if (imposed_variable == IMPOSED_P) {
            if (imposed_value < *std::max_element(pc.cbegin(), pc.cend())) {
                // This is a subcritical isobar, p is less than both critical pressures. Therefore
                // we will step in the concentration of one of the components of the binary. 
                mode = AbstractIsolineTracer::STEP_IN_RHO0;
            }
            else {
                mode = AbstractIsolineTracer::STEP_IN_T;
            }
        }
        else {
            throw ValueError("Invalid imposed variable");
        }
        return mode;
    }